

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O3

cio_error cio_server_socket_bind(cio_server_socket *server_socket,cio_socket_address *endpoint)

{
  sa_family_t sVar1;
  int iVar2;
  cio_error cVar3;
  int *piVar4;
  
  cVar3 = CIO_INVALID_ARGUMENT;
  if ((server_socket != (cio_server_socket *)0x0) &&
     (cVar3 = CIO_INVALID_ARGUMENT, endpoint != (cio_socket_address *)0x0)) {
    sVar1 = (endpoint->impl).sa.socket_address.addr.sa_family;
    if (sVar1 == 1) {
      if (((endpoint->impl).sa.field4[2] != '\0') &&
         (iVar2 = unlink((endpoint->impl).sa.field4 + 2), iVar2 == -1)) {
        piVar4 = __errno_location();
        cVar3 = CIO_SUCCESS;
        if (*piVar4 != 2) {
          cVar3 = -*piVar4;
        }
        if (cVar3 != CIO_SUCCESS) {
          return cVar3;
        }
      }
    }
    else if (sVar1 == 0) {
      return CIO_INVALID_ARGUMENT;
    }
    iVar2 = bind((server_socket->impl).ev.fd,(sockaddr *)&(endpoint->impl).sa.socket_address,
                 (endpoint->impl).len);
    cVar3 = CIO_SUCCESS;
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      cVar3 = -*piVar4;
    }
  }
  return cVar3;
}

Assistant:

enum cio_error cio_server_socket_bind(struct cio_server_socket *server_socket, const struct cio_socket_address *endpoint)
{
	if (cio_unlikely((server_socket == NULL) || (endpoint == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely((enum cio_address_family)endpoint->impl.sa.socket_address.addr.sa_family == CIO_ADDRESS_FAMILY_UNSPEC)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (is_standard_uds_socket(endpoint)) {
		enum cio_error err = try_removing_uds_file(endpoint);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			return err;
		}
	}

	const struct sockaddr *addr = &endpoint->impl.sa.socket_address.addr;
	socklen_t addr_len = endpoint->impl.len;

	int ret = bind(server_socket->impl.ev.fd, addr, addr_len);
	if (cio_unlikely(ret != 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}